

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.hpp
# Opt level: O1

void rsg::(anonymous_namespace)::convertValueRangeTempl<bool,bool>
               (ConstValueRangeAccess src,ValueRangeAccess dst)

{
  bool bVar1;
  
  bVar1 = (src.m_max)->boolVal;
  (dst.super_ConstValueRangeAccess.m_min)->boolVal = (src.m_min)->boolVal;
  (dst.super_ConstValueRangeAccess.m_max)->boolVal = bVar1;
  return;
}

Assistant:

ConstValueAccess			getMin					(void) const	{ return ConstValueAccess(*m_type, m_min);	}